

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

char * __thiscall wabt::Type::GetName(Type *this)

{
  Type *this_local;
  
  switch(this->enum_) {
  case Any:
    this_local = (Type *)0x2e61c2;
    break;
  case Void:
    this_local = (Type *)anon_var_dwarf_1003c;
    break;
  default:
    this_local = (Type *)anon_var_dwarf_1005d;
    break;
  case Func:
    this_local = (Type *)0x2e3586;
    break;
  case ExnRef:
    this_local = (Type *)anon_var_dwarf_10031;
    break;
  case ExternRef:
    this_local = (Type *)anon_var_dwarf_10052;
    break;
  case FuncRef:
    this_local = (Type *)anon_var_dwarf_1001b;
    break;
  case I16:
    this_local = (Type *)anon_var_dwarf_10010;
    break;
  case I8:
    this_local = (Type *)anon_var_dwarf_10005;
    break;
  case V128:
    this_local = (Type *)anon_var_dwarf_fe05;
    break;
  case F64:
    this_local = (Type *)0x2e6c83;
    break;
  case F32:
    this_local = (Type *)0x2e6dc5;
    break;
  case I64:
    this_local = (Type *)0x2e6e17;
    break;
  case I32:
    this_local = (Type *)0x2e6cd4;
  }
  return (char *)this_local;
}

Assistant:

const char* GetName() const {
    switch (enum_) {
      case Type::I32:       return "i32";
      case Type::I64:       return "i64";
      case Type::F32:       return "f32";
      case Type::F64:       return "f64";
      case Type::V128:      return "v128";
      case Type::I8:        return "i8";
      case Type::I16:       return "i16";
      case Type::FuncRef:   return "funcref";
      case Type::Func:      return "func";
      case Type::ExnRef:    return "exnref";
      case Type::Void:      return "void";
      case Type::Any:       return "any";
      case Type::ExternRef: return "externref";
      default:              return "<type_index>";
    }
  }